

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  ImGuiIO *pIVar1;
  bool bVar2;
  undefined1 uVar3;
  
  if (g_PrevUserCallbackKey != (GLFWkeyfun)0x0) {
    (*g_PrevUserCallbackKey)(window,key,scancode,action,mods);
  }
  pIVar1 = ImGui::GetIO();
  if (action == 1) {
    bVar2 = true;
  }
  else {
    if (action != 0) goto LAB_002e554e;
    bVar2 = false;
  }
  pIVar1->KeysDown[key] = bVar2;
LAB_002e554e:
  bVar2 = pIVar1->KeysDown[0x159];
  if (pIVar1->KeysDown[0x155] != false) {
    bVar2 = true;
  }
  pIVar1->KeyCtrl = bVar2;
  uVar3 = true;
  if (pIVar1->KeysDown[0x154] == false) {
    uVar3 = (undefined1)*(undefined4 *)(pIVar1->KeysDown + 0x158);
  }
  pIVar1->KeyShift = (bool)uVar3;
  bVar2 = pIVar1->KeysDown[0x15a];
  if (pIVar1->KeysDown[0x156] != false) {
    bVar2 = true;
  }
  pIVar1->KeyAlt = bVar2;
  bVar2 = pIVar1->KeysDown[0x15b];
  if (pIVar1->KeysDown[0x157] != false) {
    bVar2 = true;
  }
  pIVar1->KeySuper = bVar2;
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (g_PrevUserCallbackKey != NULL)
        g_PrevUserCallbackKey(window, key, scancode, action, mods);

    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
}